

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_expectOneCallInScopeButNotHappen_Test::
~TEST_MockCallTest_expectOneCallInScopeButNotHappen_Test
          (TEST_MockCallTest_expectOneCallInScopeButNotHappen_Test *this)

{
  TEST_MockCallTest_expectOneCallInScopeButNotHappen_Test *this_local;
  
  ~TEST_MockCallTest_expectOneCallInScopeButNotHappen_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockCallTest, expectOneCallInScopeButNotHappen)
{

    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("scope::foobar");
    MockExpectedCallsDidntHappenFailure expectedFailure(mockFailureTest(), expectations);

    mock("scope").expectOneCall("foobar");
    mock().checkExpectations();

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);

}